

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ow.c
# Opt level: O2

mraa_result_t mraa_uart_ow_command(mraa_uart_ow_context dev,uint8_t command,uint8_t *id)

{
  mraa_result_t mVar1;
  long lVar2;
  
  if (dev == (mraa_uart_ow_context)0x0) {
    syslog(3,"uart_ow: ow_command: context is NULL");
    mVar1 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    mVar1 = mraa_uart_ow_reset(dev);
    if (mVar1 == MRAA_SUCCESS) {
      if (id == (uint8_t *)0x0) {
        mraa_uart_ow_write_byte(dev,0xcc);
      }
      else {
        mraa_uart_ow_write_byte(dev,'U');
        for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
          mraa_uart_ow_write_byte(dev,id[lVar2]);
        }
      }
      mraa_uart_ow_write_byte(dev,command);
      mVar1 = MRAA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

mraa_result_t
mraa_uart_ow_command(mraa_uart_ow_context dev, uint8_t command, uint8_t* id)
{
    if (!dev) {
        syslog(LOG_ERR, "uart_ow: ow_command: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    /* send reset pulse first */
    mraa_result_t rv = mraa_uart_ow_reset(dev);

    if (rv != MRAA_SUCCESS)
        return rv;

    if (id) {
        /* send the match rom command */
        mraa_uart_ow_write_byte(dev, MRAA_UART_OW_CMD_MATCH_ROM);

        /* sending to a specific device, so send out the full romcode */
        int i;
        for (i = 0; i < MRAA_UART_OW_ROMCODE_SIZE; i++)
            mraa_uart_ow_write_byte(dev, id[i]);
    } else {
        /* send to all devices (or a single device if it's the only one
         * on the bus)
         */
        mraa_uart_ow_write_byte(dev, MRAA_UART_OW_CMD_SKIP_ROM);
    }

    mraa_uart_ow_write_byte(dev, command);

    return MRAA_SUCCESS;
}